

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokQueryTokenizer(Fts3Hash *pHash,char *zName,sqlite3_tokenizer_module **pp,char **pzErr)

{
  size_t sVar1;
  sqlite3_tokenizer_module *psVar2;
  int nName;
  sqlite3_tokenizer_module *p;
  char **pzErr_local;
  sqlite3_tokenizer_module **pp_local;
  char *zName_local;
  Fts3Hash *pHash_local;
  
  sVar1 = strlen(zName);
  psVar2 = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,zName,(int)sVar1 + 1);
  if (psVar2 != (sqlite3_tokenizer_module *)0x0) {
    *pp = psVar2;
  }
  else {
    sqlite3Fts3ErrMsg(pzErr,"unknown tokenizer: %s",zName);
  }
  pHash_local._4_4_ = (uint)(psVar2 == (sqlite3_tokenizer_module *)0x0);
  return pHash_local._4_4_;
}

Assistant:

static int fts3tokQueryTokenizer(
  Fts3Hash *pHash,
  const char *zName,
  const sqlite3_tokenizer_module **pp,
  char **pzErr
){
  sqlite3_tokenizer_module *p;
  int nName = (int)strlen(zName);

  p = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash, zName, nName+1);
  if( !p ){
    sqlite3Fts3ErrMsg(pzErr, "unknown tokenizer: %s", zName);
    return SQLITE_ERROR;
  }

  *pp = p;
  return SQLITE_OK;
}